

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::sse2::OrientedDiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  undefined4 uVar20;
  ulong uVar21;
  RTCFilterFunctionN p_Var22;
  RayHitK<4> *pRVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar44;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined4 uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  float fVar68;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  RayQueryContext *local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  RTCFilterFunctionNArguments local_1a8;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  float local_128 [4];
  float local_118 [4];
  undefined8 local_108 [2];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  float local_d8 [2];
  uint uStack_d0;
  uint uStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar7 = context->scene;
  uStack_d0 = Disc->sharedGeomID;
  uVar21 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar8 = (pSVar7->geometries).items[uStack_d0].ptr;
  lVar24 = *(long *)&pGVar8->field_0x58;
  _Var9 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar24 + _Var9 * uVar21);
  fVar61 = *pfVar1;
  fVar56 = pfVar1[2];
  uVar25 = (ulong)(Disc->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar24 + _Var9 * uVar25);
  fVar63 = *pfVar2;
  fVar57 = pfVar2[2];
  fStack_f0 = pfVar2[3];
  uVar26 = (ulong)(Disc->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar24 + _Var9 * uVar26);
  uVar27 = (ulong)(Disc->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar24 + _Var9 * uVar27);
  fStack_ec = pfVar4[3];
  local_1b8 = (RayQueryContext *)CONCAT44(fVar63,fVar61);
  lVar24 = *(long *)&pGVar8[1].time_range.upper;
  p_Var22 = pGVar8[1].intersectionFilterN;
  pfVar5 = (float *)(lVar24 + uVar21 * (long)p_Var22);
  local_128[0] = *pfVar5;
  local_118[0] = pfVar5[1];
  fVar17 = pfVar5[2];
  pfVar5 = (float *)(lVar24 + uVar25 * (long)p_Var22);
  local_128[1] = *pfVar5;
  local_118[1] = pfVar5[1];
  fVar18 = pfVar5[2];
  pfVar5 = (float *)(lVar24 + uVar26 * (long)p_Var22);
  local_128[2] = *pfVar5;
  local_118[2] = pfVar5[1];
  local_f8 = pfVar5[2];
  pfVar5 = (float *)(lVar24 + (long)p_Var22 * uVar27);
  local_128[3] = *pfVar5;
  local_118[3] = pfVar5[1];
  fStack_f4 = pfVar5[2];
  uStack_cc = uStack_d0;
  fVar55 = *(float *)(ray + k * 4 + 0x10);
  fVar59 = *(float *)(ray + k * 4 + 0x20);
  fVar52 = *(float *)(ray + k * 4 + 0x40);
  fVar58 = *(float *)(ray + k * 4 + 0x50);
  fVar6 = *(float *)(ray + k * 4 + 0x60);
  fVar60 = local_128[0] * fVar52 + local_118[0] * fVar58 + fVar17 * fVar6;
  fVar62 = local_128[1] * fVar52 + local_118[1] * fVar58 + fVar18 * fVar6;
  fVar64 = local_128[2] * fVar52 + local_118[2] * fVar58 + local_f8 * fVar6;
  fVar66 = local_128[3] * fVar52 + local_118[3] * fVar58 + fStack_f4 * fVar6;
  uVar28 = -(uint)(fVar60 != 0.0);
  uVar29 = -(uint)(fVar62 != 0.0);
  uVar30 = -(uint)(fVar64 != 0.0);
  uVar31 = -(uint)(fVar66 != 0.0);
  auVar67._0_8_ = CONCAT44(~uVar29,~uVar28) & 0x3f8000003f800000;
  auVar67._8_4_ = ~uVar30 & 0x3f800000;
  auVar67._12_4_ = ~uVar31 & 0x3f800000;
  auVar70._4_4_ = (uint)fVar62 & uVar29;
  auVar70._0_4_ = (uint)fVar60 & uVar28;
  auVar70._8_4_ = (uint)fVar64 & uVar30;
  auVar70._12_4_ = (uint)fVar66 & uVar31;
  local_e8 = CONCAT44(fVar57,fVar56);
  local_d8[0] = pfVar3[2];
  local_d8[1] = pfVar4[2];
  fVar53 = *(float *)(ray + k * 4);
  auVar69._0_4_ =
       (fVar61 - fVar53) * local_128[0] +
       (pfVar1[1] - fVar55) * local_118[0] + (fVar56 - fVar59) * fVar17;
  auVar69._4_4_ =
       (fVar63 - fVar53) * local_128[1] +
       (pfVar2[1] - fVar55) * local_118[1] + (fVar57 - fVar59) * fVar18;
  auVar69._8_4_ =
       (*pfVar3 - fVar53) * local_128[2] +
       (pfVar3[1] - fVar55) * local_118[2] + (pfVar3[2] - fVar59) * local_f8;
  auVar69._12_4_ =
       (*pfVar4 - fVar53) * local_128[3] +
       (pfVar4[1] - fVar55) * local_118[3] + (pfVar4[2] - fVar59) * fStack_f4;
  auVar70 = divps(auVar69,auVar67 | auVar70);
  fVar54 = *(float *)(ray + k * 4 + 0x80);
  local_168 = ZEXT416((uint)fVar54);
  fVar68 = auVar70._0_4_;
  fVar71 = auVar70._4_4_;
  fVar72 = auVar70._8_4_;
  fVar73 = auVar70._12_4_;
  fVar65 = *(float *)(ray + k * 4 + 0x30);
  uVar28 = (uint)Disc->numPrimitives;
  bVar15 = (uVar28 != 0 && fVar60 != 0.0) && (fVar65 <= fVar68 && fVar68 <= fVar54);
  auVar47._0_4_ = -(uint)bVar15;
  bVar16 = (1 < uVar28 && fVar62 != 0.0) && (fVar65 <= fVar71 && fVar71 <= fVar54);
  auVar47._4_4_ = -(uint)bVar16;
  bVar14 = (2 < uVar28 && fVar64 != 0.0) && (fVar72 <= fVar54 && fVar65 <= fVar72);
  auVar47._8_4_ = -(uint)bVar14;
  bVar13 = (3 < uVar28 && fVar66 != 0.0) && (fVar73 <= fVar54 && fVar65 <= fVar73);
  auVar47._12_4_ = -(uint)bVar13;
  iVar19 = movmskps(uVar28,auVar47);
  if (iVar19 != 0) {
    fVar61 = (fVar53 + fVar52 * fVar68) - fVar61;
    fVar63 = (fVar53 + fVar52 * fVar71) - fVar63;
    fVar65 = (fVar53 + fVar52 * fVar72) - fStack_1b0;
    fVar60 = (fVar53 + fVar52 * fVar73) - fStack_1ac;
    fVar52 = (fVar55 + fVar58 * fVar68) - pfVar1[1];
    fVar53 = (fVar55 + fVar58 * fVar71) - pfVar2[1];
    fVar54 = (fVar55 + fVar58 * fVar72) - pfVar3[1];
    fVar55 = (fVar55 + fVar58 * fVar73) - pfVar4[1];
    fVar56 = (fVar59 + fVar6 * fVar68) - fVar56;
    fVar57 = (fVar59 + fVar6 * fVar71) - fVar57;
    fVar58 = (fVar59 + fVar6 * fVar72) - fStack_e0;
    fVar59 = (fVar59 + fVar6 * fVar73) - fStack_dc;
    bVar15 = fVar61 * fVar61 + fVar52 * fVar52 + fVar56 * fVar56 < pfVar1[3] * pfVar1[3] && bVar15;
    local_1d8._0_4_ = -(uint)bVar15;
    bVar16 = fVar63 * fVar63 + fVar53 * fVar53 + fVar57 * fVar57 < fStack_f0 * fStack_f0 && bVar16;
    local_1d8._4_4_ = -(uint)bVar16;
    bVar14 = fVar65 * fVar65 + fVar54 * fVar54 + fVar58 * fVar58 < pfVar3[3] * pfVar3[3] && bVar14;
    local_1d8._8_4_ = -(uint)bVar14;
    bVar13 = fVar60 * fVar60 + fVar55 * fVar55 + fVar59 * fVar59 < fStack_ec * fStack_ec && bVar13;
    local_1d8._12_4_ = -(uint)bVar13;
    auVar11._4_4_ = local_1d8._4_4_;
    auVar11._0_4_ = local_1d8._0_4_;
    auVar11._8_4_ = local_1d8._8_4_;
    auVar11._12_4_ = local_1d8._12_4_;
    iVar19 = movmskps(iVar19,auVar11);
    if (iVar19 != 0) {
      local_148 = 0;
      uStack_140 = 0;
      local_158 = 0;
      uStack_150 = 0;
      local_138 = auVar70;
      local_108[0] = CONCAT44(fVar18,fVar17);
      auVar32._0_4_ = (uint)fVar68 & local_1d8._0_4_;
      auVar32._4_4_ = (uint)fVar71 & local_1d8._4_4_;
      auVar32._8_4_ = (uint)fVar72 & local_1d8._8_4_;
      auVar32._12_4_ = (uint)fVar73 & local_1d8._12_4_;
      auVar37._0_8_ = CONCAT44(~local_1d8._4_4_,~local_1d8._0_4_) & 0x7f8000007f800000;
      auVar37._8_4_ = ~local_1d8._8_4_ & 0x7f800000;
      auVar37._12_4_ = ~local_1d8._12_4_ & 0x7f800000;
      auVar37 = auVar37 | auVar32;
      auVar46._4_4_ = auVar37._0_4_;
      auVar46._0_4_ = auVar37._4_4_;
      auVar46._8_4_ = auVar37._12_4_;
      auVar46._12_4_ = auVar37._8_4_;
      auVar47 = minps(auVar46,auVar37);
      auVar33._0_8_ = auVar47._8_8_;
      auVar33._8_4_ = auVar47._0_4_;
      auVar33._12_4_ = auVar47._4_4_;
      auVar47 = minps(auVar33,auVar47);
      auVar34._0_4_ = -(uint)(auVar47._0_4_ == auVar37._0_4_ && bVar15);
      auVar34._4_4_ = -(uint)(auVar47._4_4_ == auVar37._4_4_ && bVar16);
      auVar34._8_4_ = -(uint)(auVar47._8_4_ == auVar37._8_4_ && bVar14);
      auVar34._12_4_ = -(uint)(auVar47._12_4_ == auVar37._12_4_ && bVar13);
      iVar19 = movmskps(iVar19,auVar34);
      uVar28 = local_1d8._0_4_;
      uVar29 = local_1d8._4_4_;
      uVar30 = local_1d8._8_4_;
      uVar31 = local_1d8._12_4_;
      if (iVar19 != 0) {
        uVar28 = auVar34._0_4_;
        uVar29 = auVar34._4_4_;
        uVar30 = auVar34._8_4_;
        uVar31 = auVar34._12_4_;
      }
      auVar12._4_4_ = uVar29;
      auVar12._0_4_ = uVar28;
      auVar12._8_4_ = uVar30;
      auVar12._12_4_ = uVar31;
      uVar28 = movmskps(iVar19,auVar12);
      lVar24 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      do {
        local_1a8.hit = (RTCHitN *)&local_c8;
        local_1a8.valid = (int *)local_1c8;
        local_68 = local_d8[lVar24];
        uVar21 = (ulong)(uint)local_68;
        pGVar8 = (pSVar7->geometries).items[uVar21].ptr;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_1d8 + lVar24 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar20 = *(undefined4 *)((long)&local_158 + lVar24 * 4);
            uVar44 = *(undefined4 *)((long)&local_148 + lVar24 * 4);
            *(float *)(ray + k * 4 + 0x80) = local_128[lVar24 + -4];
            *(float *)(ray + k * 4 + 0xc0) = local_128[lVar24];
            *(float *)(ray + k * 4 + 0xd0) = local_118[lVar24];
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_108 + lVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar20;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar44;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar24];
            *(float *)(ray + k * 4 + 0x120) = local_68;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_98 = *(undefined4 *)((long)&local_158 + lVar24 * 4);
          local_88 = *(undefined4 *)((long)&local_148 + lVar24 * 4);
          local_c8 = local_128[lVar24];
          local_b8 = local_118[lVar24];
          local_78 = (Disc->primIDs).field_0.i[lVar24];
          uVar20 = *(undefined4 *)((long)local_108 + lVar24 * 4);
          local_a8._4_4_ = uVar20;
          local_a8._0_4_ = uVar20;
          local_a8._8_4_ = uVar20;
          local_a8._12_4_ = uVar20;
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          fStack_64 = local_68;
          fStack_60 = local_68;
          fStack_5c = local_68;
          local_58 = context->user->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = context->user->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          *(float *)(ray + k * 4 + 0x80) = local_128[lVar24 + -4];
          local_1c8 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_1a8.geometryUserPtr = pGVar8->userPtr;
          local_1a8.context = context->user;
          local_1a8.N = 4;
          p_Var22 = pGVar8->intersectionFilterN;
          local_1a8.ray = (RTCRayN *)ray;
          local_178 = auVar70;
          if (p_Var22 != (RTCFilterFunctionN)0x0) {
            local_1b8 = context;
            p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&local_1a8);
            context = local_1b8;
          }
          auVar38._0_4_ = -(uint)(local_1c8._0_4_ == 0);
          auVar38._4_4_ = -(uint)(local_1c8._4_4_ == 0);
          auVar38._8_4_ = -(uint)(local_1c8._8_4_ == 0);
          auVar38._12_4_ = -(uint)(local_1c8._12_4_ == 0);
          uVar28 = movmskps((int)p_Var22,auVar38);
          pRVar23 = (RayHitK<4> *)(ulong)(uVar28 ^ 0xf);
          if ((uVar28 ^ 0xf) == 0) {
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar39 = auVar38 ^ auVar10;
            auVar70 = local_178;
          }
          else {
            p_Var22 = context->args->filter;
            if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&local_1a8);
            }
            auVar35._0_4_ = -(uint)(local_1c8._0_4_ == 0);
            auVar35._4_4_ = -(uint)(local_1c8._4_4_ == 0);
            auVar35._8_4_ = -(uint)(local_1c8._8_4_ == 0);
            auVar35._12_4_ = -(uint)(local_1c8._12_4_ == 0);
            auVar39._8_4_ = 0xffffffff;
            auVar39._0_8_ = 0xffffffffffffffff;
            auVar39._12_4_ = 0xffffffff;
            auVar39 = auVar35 ^ auVar39;
            uVar28 = movmskps((int)p_Var22,auVar35);
            pRVar23 = (RayHitK<4> *)(ulong)(uVar28 ^ 0xf);
            auVar70 = local_178;
            if ((uVar28 ^ 0xf) != 0) {
              auVar48._0_4_ = *(uint *)(local_1a8.ray + 0xc0) & auVar35._0_4_;
              auVar48._4_4_ = *(uint *)(local_1a8.ray + 0xc4) & auVar35._4_4_;
              auVar48._8_4_ = *(uint *)(local_1a8.ray + 200) & auVar35._8_4_;
              auVar48._12_4_ = *(uint *)(local_1a8.ray + 0xcc) & auVar35._12_4_;
              auVar51._0_4_ = ~auVar35._0_4_ & (uint)*(float *)local_1a8.hit;
              auVar51._4_4_ = ~auVar35._4_4_ & (uint)*(float *)(local_1a8.hit + 4);
              auVar51._8_4_ = ~auVar35._8_4_ & (uint)*(float *)(local_1a8.hit + 8);
              auVar51._12_4_ = ~auVar35._12_4_ & (uint)*(float *)(local_1a8.hit + 0xc);
              *(undefined1 (*) [16])(local_1a8.ray + 0xc0) = auVar51 | auVar48;
              fVar55 = *(float *)(local_1a8.hit + 0x14);
              fVar59 = *(float *)(local_1a8.hit + 0x18);
              fVar52 = *(float *)(local_1a8.hit + 0x1c);
              *(uint *)(local_1a8.ray + 0xd0) =
                   ~auVar35._0_4_ & (uint)*(float *)(local_1a8.hit + 0x10) |
                   *(uint *)(local_1a8.ray + 0xd0) & auVar35._0_4_;
              *(uint *)(local_1a8.ray + 0xd4) =
                   ~auVar35._4_4_ & (uint)fVar55 | *(uint *)(local_1a8.ray + 0xd4) & auVar35._4_4_;
              *(uint *)(local_1a8.ray + 0xd8) =
                   ~auVar35._8_4_ & (uint)fVar59 | *(uint *)(local_1a8.ray + 0xd8) & auVar35._8_4_;
              *(uint *)(local_1a8.ray + 0xdc) =
                   ~auVar35._12_4_ & (uint)fVar52 | *(uint *)(local_1a8.ray + 0xdc) & auVar35._12_4_
              ;
              *(undefined1 (*) [16])(local_1a8.ray + 0xe0) =
                   ~auVar35 & *(undefined1 (*) [16])(local_1a8.hit + 0x20) |
                   *(undefined1 (*) [16])(local_1a8.ray + 0xe0) & auVar35;
              *(undefined1 (*) [16])(local_1a8.ray + 0xf0) =
                   ~auVar35 & *(undefined1 (*) [16])(local_1a8.hit + 0x30) |
                   *(undefined1 (*) [16])(local_1a8.ray + 0xf0) & auVar35;
              fVar55 = *(float *)(local_1a8.hit + 0x44);
              fVar59 = *(float *)(local_1a8.hit + 0x48);
              fVar52 = *(float *)(local_1a8.hit + 0x4c);
              *(uint *)(local_1a8.ray + 0x100) =
                   ~auVar35._0_4_ & (uint)*(float *)(local_1a8.hit + 0x40) |
                   *(uint *)(local_1a8.ray + 0x100) & auVar35._0_4_;
              *(uint *)(local_1a8.ray + 0x104) =
                   ~auVar35._4_4_ & (uint)fVar55 | *(uint *)(local_1a8.ray + 0x104) & auVar35._4_4_;
              *(uint *)(local_1a8.ray + 0x108) =
                   ~auVar35._8_4_ & (uint)fVar59 | *(uint *)(local_1a8.ray + 0x108) & auVar35._8_4_;
              *(uint *)(local_1a8.ray + 0x10c) =
                   ~auVar35._12_4_ & (uint)fVar52 |
                   *(uint *)(local_1a8.ray + 0x10c) & auVar35._12_4_;
              fVar55 = *(float *)(local_1a8.hit + 0x54);
              fVar59 = *(float *)(local_1a8.hit + 0x58);
              fVar52 = *(float *)(local_1a8.hit + 0x5c);
              *(uint *)(local_1a8.ray + 0x110) =
                   *(uint *)(local_1a8.ray + 0x110) & auVar35._0_4_ |
                   ~auVar35._0_4_ & (uint)*(float *)(local_1a8.hit + 0x50);
              *(uint *)(local_1a8.ray + 0x114) =
                   *(uint *)(local_1a8.ray + 0x114) & auVar35._4_4_ | ~auVar35._4_4_ & (uint)fVar55;
              *(uint *)(local_1a8.ray + 0x118) =
                   *(uint *)(local_1a8.ray + 0x118) & auVar35._8_4_ | ~auVar35._8_4_ & (uint)fVar59;
              *(uint *)(local_1a8.ray + 0x11c) =
                   *(uint *)(local_1a8.ray + 0x11c) & auVar35._12_4_ |
                   ~auVar35._12_4_ & (uint)fVar52;
              fVar55 = *(float *)(local_1a8.hit + 100);
              fVar59 = *(float *)(local_1a8.hit + 0x68);
              fVar52 = *(float *)(local_1a8.hit + 0x6c);
              *(uint *)(local_1a8.ray + 0x120) =
                   *(uint *)(local_1a8.ray + 0x120) & auVar35._0_4_ |
                   ~auVar35._0_4_ & (uint)*(float *)(local_1a8.hit + 0x60);
              *(uint *)(local_1a8.ray + 0x124) =
                   *(uint *)(local_1a8.ray + 0x124) & auVar35._4_4_ | ~auVar35._4_4_ & (uint)fVar55;
              *(uint *)(local_1a8.ray + 0x128) =
                   *(uint *)(local_1a8.ray + 0x128) & auVar35._8_4_ | ~auVar35._8_4_ & (uint)fVar59;
              *(uint *)(local_1a8.ray + 300) =
                   *(uint *)(local_1a8.ray + 300) & auVar35._12_4_ | ~auVar35._12_4_ & (uint)fVar52;
              fVar55 = *(float *)(local_1a8.hit + 0x74);
              fVar59 = *(float *)(local_1a8.hit + 0x78);
              fVar52 = *(float *)(local_1a8.hit + 0x7c);
              *(uint *)(local_1a8.ray + 0x130) =
                   ~auVar35._0_4_ & (uint)*(float *)(local_1a8.hit + 0x70) |
                   *(uint *)(local_1a8.ray + 0x130) & auVar35._0_4_;
              *(uint *)(local_1a8.ray + 0x134) =
                   ~auVar35._4_4_ & (uint)fVar55 | *(uint *)(local_1a8.ray + 0x134) & auVar35._4_4_;
              *(uint *)(local_1a8.ray + 0x138) =
                   ~auVar35._8_4_ & (uint)fVar59 | *(uint *)(local_1a8.ray + 0x138) & auVar35._8_4_;
              *(uint *)(local_1a8.ray + 0x13c) =
                   ~auVar35._12_4_ & (uint)fVar52 |
                   *(uint *)(local_1a8.ray + 0x13c) & auVar35._12_4_;
              *(undefined1 (*) [16])(local_1a8.ray + 0x140) =
                   ~auVar35 & *(undefined1 (*) [16])(local_1a8.hit + 0x80) |
                   *(undefined1 (*) [16])(local_1a8.ray + 0x140) & auVar35;
              pRVar23 = (RayHitK<4> *)local_1a8.ray;
            }
          }
          auVar43._0_4_ = auVar39._0_4_ << 0x1f;
          auVar43._4_4_ = auVar39._4_4_ << 0x1f;
          auVar43._8_4_ = auVar39._8_4_ << 0x1f;
          auVar43._12_4_ = auVar39._12_4_ << 0x1f;
          iVar19 = movmskps((int)pRVar23,auVar43);
          uVar21 = CONCAT44((int)((ulong)pRVar23 >> 0x20),iVar19);
          if (iVar19 == 0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_168._0_4_;
            fVar55 = (float)local_168._0_4_;
            uVar20 = local_168._4_4_;
            uVar44 = local_168._8_4_;
            uVar45 = local_168._12_4_;
          }
          else {
            fVar55 = *(float *)(ray + k * 4 + 0x80);
            uVar20 = 0;
            uVar44 = 0;
            uVar45 = 0;
          }
          *(undefined4 *)(local_1d8 + lVar24 * 4) = 0;
          local_168._4_4_ = uVar20;
          local_168._0_4_ = fVar55;
          local_168._8_4_ = uVar44;
          local_168._12_4_ = uVar45;
          local_1d8._0_4_ = -(uint)(auVar70._0_4_ <= fVar55) & local_1d8._0_4_;
          local_1d8._4_4_ = -(uint)(auVar70._4_4_ <= fVar55) & local_1d8._4_4_;
          local_1d8._8_4_ = -(uint)(auVar70._8_4_ <= fVar55) & local_1d8._8_4_;
          local_1d8._12_4_ = -(uint)(auVar70._12_4_ <= fVar55) & local_1d8._12_4_;
        }
        iVar19 = movmskps((int)uVar21,local_1d8);
        if (iVar19 == 0) {
          return;
        }
        uVar28 = local_1d8._0_4_;
        uVar29 = local_1d8._4_4_;
        uVar30 = local_1d8._8_4_;
        uVar31 = local_1d8._12_4_;
        auVar40._0_4_ = uVar28 & auVar70._0_4_;
        auVar40._4_4_ = uVar29 & auVar70._4_4_;
        auVar40._8_4_ = uVar30 & auVar70._8_4_;
        auVar40._12_4_ = uVar31 & auVar70._12_4_;
        auVar49._0_8_ = CONCAT44(~uVar29,~uVar28) & 0x7f8000007f800000;
        auVar49._8_4_ = ~uVar30 & 0x7f800000;
        auVar49._12_4_ = ~uVar31 & 0x7f800000;
        auVar49 = auVar49 | auVar40;
        auVar50._4_4_ = auVar49._0_4_;
        auVar50._0_4_ = auVar49._4_4_;
        auVar50._8_4_ = auVar49._12_4_;
        auVar50._12_4_ = auVar49._8_4_;
        auVar47 = minps(auVar50,auVar49);
        auVar41._0_8_ = auVar47._8_8_;
        auVar41._8_4_ = auVar47._0_4_;
        auVar41._12_4_ = auVar47._4_4_;
        auVar47 = minps(auVar41,auVar47);
        auVar42._0_8_ =
             CONCAT44(-(uint)(auVar47._4_4_ == auVar49._4_4_) & uVar29,
                      -(uint)(auVar47._0_4_ == auVar49._0_4_) & uVar28);
        auVar42._8_4_ = -(uint)(auVar47._8_4_ == auVar49._8_4_) & uVar30;
        auVar42._12_4_ = -(uint)(auVar47._12_4_ == auVar49._12_4_) & uVar31;
        iVar19 = movmskps(iVar19,auVar42);
        auVar36 = local_1d8;
        if (iVar19 != 0) {
          auVar36._8_4_ = auVar42._8_4_;
          auVar36._0_8_ = auVar42._0_8_;
          auVar36._12_4_ = auVar42._12_4_;
        }
        uVar20 = movmskps(iVar19,auVar36);
        uVar21 = CONCAT44((int)(uVar21 >> 0x20),uVar20);
        lVar24 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }